

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moving_sphere.h
# Opt level: O2

bool __thiscall
moving_sphere::hit(moving_sphere *this,ray *r,double t_min,double t_max,hit_record *rec)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vec3 local_68;
  vec3 local_48;
  
  dVar8 = (r->orig).e[0];
  dVar5 = (r->orig).e[1];
  dVar7 = (r->orig).e[2];
  center(&local_68,this,r->tm);
  dVar8 = dVar8 - local_68.e[0];
  dVar5 = dVar5 - local_68.e[1];
  dVar7 = dVar7 - local_68.e[2];
  dVar6 = (r->dir).e[0];
  dVar1 = (r->dir).e[1];
  dVar2 = (r->dir).e[2];
  dVar4 = dVar2 * dVar2 + dVar6 * dVar6 + dVar1 * dVar1;
  dVar6 = dVar8 * dVar6 + dVar5 * dVar1 + dVar7 * dVar2;
  dVar8 = dVar6 * dVar6 -
          ((dVar7 * dVar7 + dVar8 * dVar8 + dVar5 * dVar5) - this->radius * this->radius) * dVar4;
  if (dVar8 <= 0.0) {
    bVar3 = false;
  }
  else {
    dVar7 = SQRT(dVar8);
    dVar5 = dVar7;
    if (dVar8 < 0.0) {
      dVar5 = sqrt(dVar8);
    }
    if (dVar8 < 0.0) {
      dVar7 = sqrt(dVar8);
    }
    dVar8 = (-dVar6 - dVar7) / dVar4;
    if ((t_max <= dVar8) || (dVar8 <= t_min)) {
      dVar8 = (dVar5 - dVar6) / dVar4;
      if (t_max <= dVar8) {
        return false;
      }
      if (dVar8 <= t_min) {
        return false;
      }
      rec->t = dVar8;
    }
    else {
      rec->t = dVar8;
    }
    ray::at(&local_68,r,dVar8);
    (rec->p).e[2] = local_68.e[2];
    (rec->p).e[0] = local_68.e[0];
    (rec->p).e[1] = local_68.e[1];
    center(&local_48,this,r->tm);
    local_68.e[1] = 1.0 / this->radius;
    local_68.e[2] = ((rec->p).e[2] - local_48.e[2]) * local_68.e[1];
    local_68.e[0] = local_68.e[1] * ((rec->p).e[0] - local_48.e[0]);
    local_68.e[1] = local_68.e[1] * ((rec->p).e[1] - local_48.e[1]);
    hit_record::set_face_normal(rec,r,&local_68);
    std::__shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>,
               &(this->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool moving_sphere::hit(const ray& r, double t_min, double t_max, hit_record& rec) const{
    vec3 oc = r.origin() - center(r.time());
    auto a = r.direction().length_squared();
    auto half_b = dot(oc,r.direction());
    auto c = oc.length_squared() - radius * radius;
    auto discriminant = half_b * half_b - a * c;

    if (discriminant > 0) {
        auto root = sqrt(discriminant);
        auto temp = (-half_b - sqrt(discriminant)) / a;
        if (temp < t_max && temp > t_min){
            rec.t = temp;
            rec.p = r.at(rec.t);
            vec3 outward_normal = (rec.p - center(r.time())) / radius;
            rec.set_face_normal(r,outward_normal);
            rec.mat_ptr = mat_ptr;
            return true;
        }

        temp = (-half_b + root) / a;
        if (temp < t_max && temp > t_min){
            rec.t = temp;
            rec.p = r.at(rec.t);
            vec3 outward_normal = (rec.p - center(r.time())) / radius;
            rec.set_face_normal(r,outward_normal);
            rec.mat_ptr = mat_ptr;
            return true;
        }
    }

    return false;
}